

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall BinaryReaderTest_ReadInt_Test::TestBody(BinaryReaderTest_ReadInt_Test *this)

{
  CStringRef arg0;
  NLStringRef data_00;
  NLStringRef data_01;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  AssertionResult gtest_ar_3;
  BinaryReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TestBinaryReader<mp::internal::IdentityConverter> reader;
  NLStringRef str;
  size_t size;
  int data [3];
  undefined4 in_stack_fffffffffffffd50;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd54;
  int *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  NLStringRef *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  Type in_stack_fffffffffffffd7c;
  AssertionResult *in_stack_fffffffffffffd80;
  undefined6 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8e;
  undefined1 in_stack_fffffffffffffd8f;
  CStringRef in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  char *in_stack_fffffffffffffda0;
  BasicCStringRef<char> local_240;
  Message *in_stack_fffffffffffffdc8;
  AssertHelper *in_stack_fffffffffffffdd0;
  AssertionResult local_1a0 [3];
  int local_170;
  byte local_169;
  BasicCStringRef<char> local_168;
  string local_160 [32];
  AssertionResult local_140 [2];
  int local_120;
  undefined4 local_11c;
  AssertionResult local_118 [3];
  int local_e8;
  undefined4 local_e4;
  AssertionResult local_e0;
  BasicCStringRef<char> local_d0;
  Message *local_c8;
  AssertHelper *pAStack_c0;
  Message *local_30;
  AssertHelper *pAStack_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_10;
  
  local_18 = 0xffffffea0000000b;
  local_10 = 0;
  local_20 = 8;
  mp::NLStringRef::NLStringRef
            (in_stack_fffffffffffffd70,
             (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (size_t)in_stack_fffffffffffffd60);
  local_c8 = local_30;
  pAStack_c0 = pAStack_28;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_d0,"test");
  data_00.data_._4_4_ = in_stack_fffffffffffffd9c;
  data_00.data_._0_4_ = in_stack_fffffffffffffd98;
  data_00.size_ = (size_t)in_stack_fffffffffffffda0;
  TestBinaryReader<mp::internal::IdentityConverter>::TestBinaryReader
            ((TestBinaryReader<mp::internal::IdentityConverter> *)
             CONCAT17(in_stack_fffffffffffffd8f,
                      CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)),data_00,
             in_stack_fffffffffffffd90);
  local_e4 = 0xb;
  local_e8 = mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>
                       ((BinaryReader<mp::internal::IdentityConverter> *)
                        CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (int *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffda0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x146f34);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               (char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60
              );
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    testing::Message::~Message((Message *)0x146f91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x146fe9);
  local_11c = 0xffffffea;
  iVar3 = mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>
                    ((BinaryReader<mp::internal::IdentityConverter> *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  local_120 = iVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (int *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffd90.data_ =
         testing::AssertionResult::failure_message((AssertionResult *)0x1470a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               (char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60
              );
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    testing::Message::~Message((Message *)0x147105);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x14715d);
  testing::AssertionSuccess();
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_140);
  if ((bool)uVar2) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_168,"test:offset {}: unexpected end of file")
    ;
    arg0.data_._6_1_ = in_stack_fffffffffffffd8e;
    arg0.data_._0_6_ = in_stack_fffffffffffffd88;
    arg0.data_._7_1_ = uVar2;
    fmt::format<unsigned_long>(arg0,(unsigned_long *)in_stack_fffffffffffffd80);
    local_169 = 0;
    in_stack_fffffffffffffd8e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffd8e) {
      mp::internal::BinaryReader<mp::internal::IdentityConverter>::ReadInt<int>
                ((BinaryReader<mp::internal::IdentityConverter> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    }
    if ((local_169 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffd80,
                 (char (*) [110])CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_170 = 2;
    }
    else {
      local_170 = 0;
    }
    std::__cxx11::string::~string(local_160);
    if (local_170 == 0) goto LAB_00147539;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffd80);
  in_stack_fffffffffffffd58 =
       (int *)testing::AssertionResult::failure_message((AssertionResult *)0x147491);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
             (char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  testing::Message::~Message((Message *)0x1474ee);
LAB_00147539:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x147546);
  ChangeEndianness<int>((int *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_240,"test");
  data_01.data_._4_4_ = iVar3;
  data_01.data_._0_4_ = uVar4;
  data_01.size_ = (size_t)in_stack_fffffffffffffda0;
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            ((TestBinaryReader<mp::internal::EndiannessConverter> *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffd8e,in_stack_fffffffffffffd88)),data_01,
             in_stack_fffffffffffffd90);
  iVar3 = mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>
                    ((BinaryReader<mp::internal::EndiannessConverter> *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (int *)CONCAT44(iVar3,in_stack_fffffffffffffd50));
  TestBinaryReader<mp::internal::EndiannessConverter>::~TestBinaryReader
            ((TestBinaryReader<mp::internal::EndiannessConverter> *)
             CONCAT44(iVar3,in_stack_fffffffffffffd50));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    testing::AssertionResult::failure_message((AssertionResult *)0x14768b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               (char *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60
              );
    testing::internal::AssertHelper::operator=(pAStack_28,local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(iVar3,uVar4));
    testing::Message::~Message((Message *)0x1476d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x147726);
  TestBinaryReader<mp::internal::IdentityConverter>::~TestBinaryReader
            ((TestBinaryReader<mp::internal::IdentityConverter> *)CONCAT44(iVar3,uVar4));
  return;
}

Assistant:

TEST(BinaryReaderTest, ReadInt) {
  int data[] = {11, -22, 0};
  std::size_t size = sizeof(data) - sizeof(int);
  mp::NLStringRef str(reinterpret_cast<char*>(data), size);
  TestBinaryReader<> reader(str);
  EXPECT_EQ(11, reader.ReadInt<int>());
  EXPECT_EQ(-22, reader.ReadInt<int>());
  EXPECT_THROW_MSG(reader.ReadInt<int>(), mp::BinaryReadError,
                   fmt::format("test:offset {}: unexpected end of file", size));
  ChangeEndianness(data[0]);
  EXPECT_EQ(11, TestBinaryReader<EndiannessConverter>(str).ReadInt<int>());
}